

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

double __thiscall llvm::detail::IEEEFloat::remainder(IEEEFloat *this,double __x,double __y)

{
  byte bVar1;
  opStatus oVar2;
  integerPart *parts;
  IEEEFloat *in_RSI;
  uint uVar3;
  uint uVar4;
  double extraout_XMM0_Qa;
  MutableArrayRef<unsigned_long> parts_00;
  bool ignored;
  IEEEFloat V;
  
  IEEEFloat(&V,this);
  bVar1 = this->field_0x12;
  oVar2 = divide(&V,in_RSI,rmNearestTiesToEven);
  if (oVar2 != opDivByZero) {
    uVar3 = this->semantics->precision + 0x40;
    uVar4 = uVar3 >> 6;
    parts = (integerPart *)operator_new__((ulong)(uVar4 << 3));
    uVar3 = uVar3 & 0xffffffc0;
    parts_00.super_ArrayRef<unsigned_long>.Length._0_4_ = uVar4;
    parts_00.super_ArrayRef<unsigned_long>.Data = parts;
    parts_00.super_ArrayRef<unsigned_long>.Length._4_4_ = 0;
    oVar2 = convertToInteger(&V,parts_00,uVar3,true,rmNearestTiesToEven,&ignored);
    if (oVar2 != opInvalidOp) {
      oVar2 = convertFromZeroExtendedInteger(&V,parts,uVar3,true,rmNearestTiesToEven);
      if (oVar2 != opOK) {
        __assert_fail("fs==opOK",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x6c3,
                      "IEEEFloat::opStatus llvm::detail::IEEEFloat::remainder(const IEEEFloat &)");
      }
      oVar2 = multiply(&V,in_RSI,rmNearestTiesToEven);
      if ((oVar2 & ~opInexact) != opOK) {
        __assert_fail("fs==opOK || fs==opInexact",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x6c6,
                      "IEEEFloat::opStatus llvm::detail::IEEEFloat::remainder(const IEEEFloat &)");
      }
      oVar2 = subtract(this,&V,rmNearestTiesToEven);
      if ((oVar2 & (opUnderflow|opOverflow|opDivByZero|opInvalidOp)) != opOK) {
        __assert_fail("fs==opOK || fs==opInexact",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x6c9,
                      "IEEEFloat::opStatus llvm::detail::IEEEFloat::remainder(const IEEEFloat &)");
      }
      if ((this->field_0x12 & 7) == 3) {
        this->field_0x12 = this->field_0x12 & 0xf3 | bVar1 & 8;
      }
    }
    operator_delete__(parts);
  }
  ~IEEEFloat(&V);
  return extraout_XMM0_Qa;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::remainder(const IEEEFloat &rhs) {
  opStatus fs;
  IEEEFloat V = *this;
  unsigned int origSign = sign;

  fs = V.divide(rhs, rmNearestTiesToEven);
  if (fs == opDivByZero)
    return fs;

  int parts = partCount();
  integerPart *x = new integerPart[parts];
  bool ignored;
  fs = V.convertToInteger(makeMutableArrayRef(x, parts),
                          parts * integerPartWidth, true, rmNearestTiesToEven,
                          &ignored);
  if (fs == opInvalidOp) {
    delete[] x;
    return fs;
  }

  fs = V.convertFromZeroExtendedInteger(x, parts * integerPartWidth, true,
                                        rmNearestTiesToEven);
  assert(fs==opOK); (void)fs; // should always work

  fs = V.multiply(rhs, rmNearestTiesToEven);
  assert(fs==opOK || fs==opInexact); (void)fs; // should not overflow or underflow

  fs = subtract(V, rmNearestTiesToEven);
  assert(fs==opOK || fs==opInexact); (void)fs; // likewise

  if (isZero())
    sign = origSign;    // IEEE754 requires this
  delete[] x;
  return fs;
}